

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O0

void __thiscall aim_t::EnterLinePortal(aim_t *this,line_t *li,double frac)

{
  bool bVar1;
  TVector2<double> local_180;
  TVector3<double> local_170;
  undefined1 local_158 [8];
  DVector2 pos;
  FLinePortal *port;
  aim_t newtrace;
  double frac_local;
  line_t *li_local;
  aim_t *this_local;
  
  newtrace._280_8_ = frac;
  Clone((aim_t *)&port,this);
  pos.Y = (double)line_t::getPortal(li);
  if ((((FLinePortal *)pos.Y)->mType == '\x03') || ((this->flags & 0x20U) == 0)) {
    TAngle<double>::operator=((TAngle<double> *)&newtrace.aimtarget,&this->toppitch);
    TAngle<double>::operator=(&newtrace.toppitch,&this->bottompitch);
    newtrace.lastceilingplane._0_4_ = this->aimdir;
    newtrace.startfrac._1_1_ = *(char *)((long)pos.Y + 0x20) != '\x03';
    TVector3<double>::operator=((TVector3<double> *)&newtrace.aimdir,&this->startpos);
    TVector2<double>::operator=((TVector2<double> *)&newtrace.startpos.Z,&this->aimtrace);
    P_TranslatePortalXY(li,(double *)&newtrace.aimdir,&newtrace.startpos.X);
    P_TranslatePortalZ(li,&newtrace.startpos.Y);
    P_TranslatePortalVXVY(li,&newtrace.startpos.Z,&newtrace.aimtrace.X);
    newtrace.aimtrace.Y = (double)newtrace._280_8_ + 1.0 / this->attackrange;
    ::operator*(&local_180,newtrace.aimtrace.Y);
    operator+(&local_170,(TVector3<double> *)&newtrace.aimdir,&local_180);
    TVector2<double>::TVector2((TVector2<double> *)local_158,&local_170);
    newtrace._192_8_ = P_PointInSector((DVector2 *)local_158);
    P_TranslatePortalZ(li,&this->limitz);
    bVar1 = FBoolCVar::operator_cast_to_bool(&aimdebug);
    if (bVar1) {
      Printf("-----Entering line portal from sector %d to sector %d\n",
             (ulong)(uint)this->lastsector->sectornum,(ulong)*(uint *)(newtrace._192_8_ + 0x1fc));
    }
    AimTraverse((aim_t *)&port);
    SetResult(this,&this->linetarget,(AimTarget *)&newtrace.bottompitch);
    SetResult(this,&this->thing_friend,(AimTarget *)&newtrace.linetarget.frac);
    SetResult(this,&this->thing_other,(AimTarget *)&newtrace.thing_friend.frac);
  }
  return;
}

Assistant:

void EnterLinePortal(line_t *li, double frac)
	{
		aim_t newtrace = Clone();

		FLinePortal *port = li->getPortal();
		if (port->mType != PORTT_LINKED && (flags & ALF_PORTALRESTRICT)) return;

		newtrace.toppitch = toppitch;
		newtrace.bottompitch = bottompitch;
		newtrace.aimdir = aimdir;
		newtrace.unlinked = (port->mType != PORTT_LINKED);
		newtrace.startpos = startpos;
		newtrace.aimtrace = aimtrace;
		P_TranslatePortalXY(li, newtrace.startpos.X, newtrace.startpos.Y);
		P_TranslatePortalZ(li, newtrace.startpos.Z);
		P_TranslatePortalVXVY(li, newtrace.aimtrace.X, newtrace.aimtrace.Y);

		newtrace.startfrac = frac + 1 / attackrange;	// this is to skip the transition line to the portal which would produce a bogus opening

		DVector2 pos = newtrace.startpos + newtrace.aimtrace * newtrace.startfrac;

		newtrace.lastsector = P_PointInSector(pos);
		P_TranslatePortalZ(li, limitz);
		if (aimdebug)
			Printf("-----Entering line portal from sector %d to sector %d\n", lastsector->sectornum, newtrace.lastsector->sectornum);
		newtrace.AimTraverse();
		SetResult(linetarget, newtrace.linetarget);
		SetResult(thing_friend, newtrace.thing_friend);
		SetResult(thing_other, newtrace.thing_other);
	}